

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kops.c
# Opt level: O0

void m68k_op_movea_32_i(void)

{
  uint uVar1;
  
  uVar1 = m68ki_read_imm_32();
  m68ki_cpu.dar[(ulong)(m68ki_cpu.ir >> 9 & 7) + 8] = uVar1;
  return;
}

Assistant:

static void m68k_op_movea_32_i(void)
{
	AX = OPER_I_32();
}